

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O1

void crnlib::LzmaEnc_Init(CLzmaEnc *p)

{
  int iVar1;
  long lVar2;
  UInt16 (*paUVar3) [64];
  uint uVar4;
  UInt16 (*paUVar5) [16];
  ulong uVar6;
  UInt32 j_1;
  UInt32 j;
  long lVar7;
  
  lVar2 = 0;
  p->state = 0;
  p->reps[0] = 0;
  p->reps[1] = 0;
  p->reps[2] = 0;
  p->reps[3] = 0;
  (p->rc).low = 0;
  (p->rc).range = 0xffffffff;
  (p->rc).cacheSize = 1;
  (p->rc).cache = '\0';
  (p->rc).buf = (p->rc).bufBase;
  (p->rc).processed = 0;
  (p->rc).res = 0;
  paUVar5 = p->isRep0Long;
  do {
    lVar7 = 0;
    do {
      paUVar5[-0xf][lVar7] = 0x400;
      (*paUVar5)[lVar7] = 0x400;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x10);
    p->isRep[lVar2] = 0x400;
    p->isRepG0[lVar2] = 0x400;
    p->isRepG1[lVar2] = 0x400;
    p->isRepG2[lVar2] = 0x400;
    lVar2 = lVar2 + 1;
    paUVar5 = paUVar5 + 1;
  } while (lVar2 != 0xc);
  uVar4 = p->lc + p->lp;
  if (uVar4 < 0x18) {
    iVar1 = 0x300 << ((byte)uVar4 & 0x1f);
    uVar6 = 0;
    do {
      p->litProbs[uVar6] = 0x400;
      uVar6 = uVar6 + 1;
    } while (iVar1 + (uint)(iVar1 == 0) != uVar6);
  }
  paUVar3 = p->posSlotEncoder;
  lVar2 = 0;
  do {
    lVar7 = 0;
    do {
      (*paUVar3)[lVar7] = 0x400;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    lVar2 = lVar2 + 1;
    paUVar3 = paUVar3 + 1;
  } while (lVar2 != 4);
  lVar2 = 0;
  do {
    p->posEncoders[lVar2] = 0x400;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x72);
  (p->lenEnc).p.choice = 0x400;
  (p->lenEnc).p.choice2 = 0x400;
  lVar2 = 0;
  do {
    (p->lenEnc).p.low[lVar2] = 0x400;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x80);
  lVar2 = 0;
  do {
    (p->lenEnc).p.mid[lVar2] = 0x400;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x80);
  lVar2 = 0;
  do {
    (p->lenEnc).p.high[lVar2] = 0x400;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x100);
  (p->repLenEnc).p.choice = 0x400;
  (p->repLenEnc).p.choice2 = 0x400;
  lVar2 = 0;
  do {
    (p->repLenEnc).p.low[lVar2] = 0x400;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x80);
  lVar2 = 0;
  do {
    (p->repLenEnc).p.mid[lVar2] = 0x400;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x80);
  lVar2 = 0;
  do {
    (p->repLenEnc).p.high[lVar2] = 0x400;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x100);
  lVar2 = 0;
  do {
    p->posAlignEncoder[lVar2] = 0x400;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  p->optimumEndIndex = 0;
  p->optimumCurrentIndex = 0;
  p->additionalOffset = 0;
  p->pbMask = ~(-1 << ((byte)p->pb & 0x1f));
  p->lpMask = ~(-1 << ((byte)p->lp & 0x1f));
  return;
}

Assistant:

void LzmaEnc_Init(CLzmaEnc* p) {
  UInt32 i;
  p->state = 0;
  for (i = 0; i < LZMA_NUM_REPS; i++)
    p->reps[i] = 0;

  RangeEnc_Init(&p->rc);

  for (i = 0; i < kNumStates; i++) {
    UInt32 j;
    for (j = 0; j < LZMA_NUM_PB_STATES_MAX; j++) {
      p->isMatch[i][j] = kProbInitValue;
      p->isRep0Long[i][j] = kProbInitValue;
    }
    p->isRep[i] = kProbInitValue;
    p->isRepG0[i] = kProbInitValue;
    p->isRepG1[i] = kProbInitValue;
    p->isRepG2[i] = kProbInitValue;
  }

  {
    UInt32 num = 0x300 << (p->lp + p->lc);
    for (i = 0; i < num; i++)
      p->litProbs[i] = kProbInitValue;
  }

  {
    for (i = 0; i < kNumLenToPosStates; i++) {
      CLzmaProb* probs = p->posSlotEncoder[i];
      UInt32 j;
      for (j = 0; j < (1 << kNumPosSlotBits); j++)
        probs[j] = kProbInitValue;
    }
  }
  {
    for (i = 0; i < kNumFullDistances - kEndPosModelIndex; i++)
      p->posEncoders[i] = kProbInitValue;
  }

  LenEnc_Init(&p->lenEnc.p);
  LenEnc_Init(&p->repLenEnc.p);

  for (i = 0; i < (1 << kNumAlignBits); i++)
    p->posAlignEncoder[i] = kProbInitValue;

  p->optimumEndIndex = 0;
  p->optimumCurrentIndex = 0;
  p->additionalOffset = 0;

  p->pbMask = (1 << p->pb) - 1;
  p->lpMask = (1 << p->lp) - 1;
}